

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsdeviceintegration.cpp
# Opt level: O1

void __thiscall
QEglFSDeviceIntegration::waitForVSync(QEglFSDeviceIntegration *this,QPlatformSurface *surface)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  int arg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (waitForVSync(QPlatformSurface*)::forceSync == '\0') {
    waitForVSync();
  }
  if ((framebuffer != -1 & waitForVSync::forceSync) == 1) {
    iVar2 = ioctl(framebuffer,0x40044620);
    if (iVar2 == -1) {
      waitForVSync();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSDeviceIntegration::waitForVSync(QPlatformSurface *surface) const
{
    Q_UNUSED(surface);

#if defined(Q_OS_LINUX) && defined(FBIO_WAITFORVSYNC)
    static const bool forceSync = qEnvironmentVariableIntValue("QT_QPA_EGLFS_FORCEVSYNC");
    if (forceSync && framebuffer != -1) {
        int arg = 0;
        if (ioctl(framebuffer, FBIO_WAITFORVSYNC, &arg) == -1)
            qWarning("Could not wait for vsync.");
    }
#endif
}